

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<kj::Url::QueryParam> * __thiscall
kj::ArrayBuilder<kj::Url::QueryParam>::operator=
          (ArrayBuilder<kj::Url::QueryParam> *this,ArrayBuilder<kj::Url::QueryParam> *other)

{
  QueryParam *pQVar1;
  RemoveConst<kj::Url::QueryParam> *pRVar2;
  QueryParam *pQVar3;
  ArrayDisposer *pAVar4;
  
  pQVar1 = this->ptr;
  if (pQVar1 != (QueryParam *)0x0) {
    pRVar2 = this->pos;
    pQVar3 = this->endPtr;
    this->ptr = (QueryParam *)0x0;
    this->pos = (RemoveConst<kj::Url::QueryParam> *)0x0;
    this->endPtr = (QueryParam *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pQVar1,0x30,((long)pRVar2 - (long)pQVar1 >> 4) * -0x5555555555555555,
               ((long)pQVar3 - (long)pQVar1 >> 4) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::Url::QueryParam,_false>::destruct);
  }
  pRVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (QueryParam *)0x0;
  other->pos = (RemoveConst<kj::Url::QueryParam> *)0x0;
  other->endPtr = (QueryParam *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }